

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O2

void __thiscall spirv_cross::CompilerGLSL::ray_tracing_khr_fixup_locations(CompilerGLSL *this)

{
  TypedID<(spirv_cross::Types)0> *pTVar1;
  size_t sVar2;
  bool bVar3;
  uint uVar4;
  SPIRVariable *var;
  long lVar5;
  uint32_t argument;
  LoopLock local_40;
  ParsedIR *local_38;
  
  local_38 = &(this->super_Compiler).ir;
  ParsedIR::create_loop_hard_lock(local_38);
  pTVar1 = (this->super_Compiler).ir.ids_for_type[2].
           super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr;
  sVar2 = (this->super_Compiler).ir.ids_for_type[2].
          super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size;
  argument = 0;
  for (lVar5 = 0; sVar2 << 2 != lVar5; lVar5 = lVar5 + 4) {
    uVar4 = *(uint *)((long)&pTVar1->id + lVar5);
    if ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr[uVar4].type ==
        TypeVariable) {
      var = ParsedIR::get<spirv_cross::SPIRVariable>(local_38,uVar4);
      uVar4 = var->storage - CallableDataKHR;
      if ((uVar4 < 0xf) && ((0x4403U >> (uVar4 & 0x1f) & 1) != 0)) {
        bVar3 = Compiler::is_hidden_variable(&this->super_Compiler,var,false);
        if (!bVar3) {
          Compiler::set_decoration
                    (&this->super_Compiler,(ID)(var->super_IVariant).self.id,DecorationLocation,
                     argument);
          argument = argument + 1;
        }
      }
    }
  }
  ParsedIR::LoopLock::~LoopLock(&local_40);
  return;
}

Assistant:

void CompilerGLSL::ray_tracing_khr_fixup_locations()
{
	uint32_t location = 0;
	ir.for_each_typed_id<SPIRVariable>([&](uint32_t, SPIRVariable &var) {
		// Incoming payload storage can also be used for tracing.
		if (var.storage != StorageClassRayPayloadKHR && var.storage != StorageClassCallableDataKHR &&
		    var.storage != StorageClassIncomingRayPayloadKHR && var.storage != StorageClassIncomingCallableDataKHR)
			return;
		if (is_hidden_variable(var))
			return;
		set_decoration(var.self, DecorationLocation, location++);
	});
}